

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splayTest.cpp
# Opt level: O3

void testConfigurationCorrectness(int dataCount,int minimumN)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  bool spin;
  int iVar7;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  vector<double,_std::allocator<double>_> aF;
  vector<double,_std::allocator<double>_> aL;
  vector<double,_std::allocator<double>_> aJ;
  double local_1c0;
  double local_1b8;
  vector<double,_std::allocator<double>_> local_1a0;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_170;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_130 [232];
  double dStack_48;
  
  randomVector(&local_170,mJ + 1);
  randomVector(&local_188,mL + 1);
  randomVector(&local_1a0,mF + 1);
  SplayWeightConfiguration::SplayWeightConfiguration
            ((SplayWeightConfiguration *)local_130,&local_170,&local_188,&local_1a0);
  std::chrono::_V2::system_clock::now();
  if (dataCount < 1) {
    local_1c0 = 0.0;
  }
  else {
    local_1c0 = 0.0;
    iVar7 = dataCount;
    do {
      uVar4 = rand();
      uVar3 = local_130._160_4_;
      if ((uVar4 & 1) == 0) {
        if (minimumN < (int)local_130._160_4_) {
          iVar5 = rand();
          iVar5 = iVar5 % (int)uVar3;
          dVar1 = SplayWeightConfiguration::removeDeltaWeightJL
                            ((SplayWeightConfiguration *)local_130,
                             ((pointer)(local_130._0_8_ + (long)iVar5 * 0x10))->first,
                             ((pointer)(local_130._0_8_ + (long)iVar5 * 0x10))->second);
          dVar2 = SplayWeightConfiguration::deltaF
                            ((SplayWeightConfiguration *)local_130,local_130._160_4_ + -1);
          dStack_48 = dStack_48 - dVar2;
          local_130._224_8_ = dVar1 + (double)local_130._224_8_;
          SplayWeightConfiguration::removeSpin((SplayWeightConfiguration *)local_130,iVar5);
        }
      }
      else {
        iVar5 = rand();
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        spin = (bool)((byte)iVar5 & 1);
        dVar1 = dVar1 * (random_double._M_param._M_b - random_double._M_param._M_a) +
                random_double._M_param._M_a + -0.5;
        dVar1 = dVar1 + dVar1;
        dVar2 = SplayWeightConfiguration::insertDeltaWeightJL
                          ((SplayWeightConfiguration *)local_130,spin,dVar1);
        local_148._8_4_ = extraout_XMM0_Dc;
        local_148._0_8_ = dVar2;
        local_148._12_4_ = extraout_XMM0_Dd;
        dVar2 = SplayWeightConfiguration::deltaF
                          ((SplayWeightConfiguration *)local_130,local_130._160_4_);
        local_158._8_4_ = extraout_XMM0_Dc_00;
        local_158._0_8_ = dVar2;
        local_158._12_4_ = extraout_XMM0_Dd_00;
        SplayWeightConfiguration::insertSpin((SplayWeightConfiguration *)local_130,spin,dVar1);
        dVar1 = (double)local_158._0_8_ + dStack_48;
        unique0x1000039a = SUB84(dVar1,0);
        local_130._224_8_ = (double)local_148._0_8_ + (double)local_130._224_8_;
        unique0x1000039e = (int)((ulong)dVar1 >> 0x20);
      }
      if (local_130._160_4_ == 0) {
        local_1b8 = dStack_48;
      }
      else {
        local_1b8 = (double)local_130._224_8_ / (double)(int)local_130._160_4_ + dStack_48;
      }
      dVar1 = SplayWeightConfiguration::bruteForceMBH((SplayWeightConfiguration *)local_130);
      local_1c0 = local_1c0 + ABS((local_1b8 - dVar1) / dVar1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average error for m^2 configuration = ",0x26);
  poVar6 = std::ostream::_M_insert<double>(local_1c0 / (double)dataCount);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  SplayWeightConfiguration::~SplayWeightConfiguration((SplayWeightConfiguration *)local_130);
  if (local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testConfigurationCorrectness(int dataCount = 10000, int minimumN = 30) {
    // run a test of dataCount steps, n cannot be decreased if lower than minimumN
    // test the correctness by comparing with O(n^2) weight calculation
    vector<double> aJ = randomVector(mJ + 1);
    vector<double> aL = randomVector(mL + 1);
    vector<double> aF = randomVector(mF + 1);
    bool efficiencyTest = false;
    SplayWeightConfiguration c(aJ, aL, aF);
    double dWeightJL, dWeightF;
    double totalError = 0.0;
    // int dataCount = 10000;
    double averageN = 0;

    auto millisecBeforeSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    for (int i = 0; i < dataCount; ++i) {
        bool isInsert = randomInt(2);
        if (isInsert) {
            bool spin = randomInt(2);
            double tau = generateDataPoint();
            dWeightJL = c.insertDeltaWeightJL(spin, tau);
            dWeightF = c.insertDeltaWeightF();
            c.insertSpin(spin, tau);
            c.updateWeight(dWeightJL, dWeightF);
        } else if (c.n > minimumN) {
            int idx = randomInt(c.n);
            dWeightJL = c.removeDeltaWeightJL(c.c[idx].first, c.c[idx].second);
            dWeightF = c.removeDeltaWeightF();
            c.updateWeight(dWeightJL, dWeightF);
            c.removeSpin(idx);
        }
        if (!efficiencyTest) {
            double weight = c.getWeight(), mbhWeight = c.bruteForceMBH();
            totalError += fabs((weight - mbhWeight) / mbhWeight);
        }

        averageN += c.n;
    }
    auto millisecAfterSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    averageN /= dataCount;
    if (efficiencyTest) {
        cout << "Test the efficiency for a simulation of " << dataCount << " steps." << endl;
        cout << (millisecAfterSimulation - millisecBeforeSimulation) * 1000000.0 / dataCount << " milliseconds for 10^6 steps, with average n = " << averageN << ", (mL, mJ, mF) = (" << mL << ", " << mJ << ", " << mF << ")." << endl;
    }
    if (!efficiencyTest) {
        double averageError = totalError / dataCount;
        cout << "average error for m^2 configuration = " << averageError << endl;
    }
    // c.printA();
}